

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::mouseMoveEvent(QListView *this,QMouseEvent *e)

{
  QListViewPrivate *this_00;
  QWidget *this_01;
  QRect QVar1;
  QRect QVar2;
  State SVar3;
  int iVar4;
  int iVar5;
  QPoint QVar6;
  QStyle *pQVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QPointF QVar9;
  QRect local_68;
  qreal local_58;
  qreal local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)->
       widget_attributes & 0x8000) != 0) {
    this_00 = *(QListViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QAbstractItemView::mouseMoveEvent((QAbstractItemView *)this,e);
    SVar3 = QAbstractItemView::state((QAbstractItemView *)this);
    QVar2.x2.m_i = local_48.x2.m_i;
    QVar2.y2.m_i = local_48.y2.m_i;
    QVar2.x1.m_i = local_48.x1.m_i;
    QVar2.y1.m_i = local_48.y1.m_i;
    QVar1.x2.m_i = local_48.x2.m_i;
    QVar1.y2.m_i = local_48.y2.m_i;
    QVar1.x1.m_i = local_48.x1.m_i;
    QVar1.y1.m_i = local_48.y1.m_i;
    if (((SVar3 == DragSelectingState) && (local_48 = QVar1, this_00->showElasticBand == true)) &&
       (local_48 = QVar2, SingleSelection < (this_00->super_QAbstractItemViewPrivate).selectionMode)
       ) {
      QVar9 = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_50 = QVar9.yp;
      local_58 = QVar9.xp;
      QVar6 = QPointF::toPoint((QPointF *)&local_58);
      iVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b0))(this);
      iVar5 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b8))(this);
      local_48._0_8_ = (this_00->super_QAbstractItemViewPrivate).pressedPosition;
      local_48.y2.m_i = iVar5 + QVar6.yp.m_i.m_i;
      local_48.x2.m_i = iVar4 + QVar6.xp.m_i.m_i;
      local_48 = (QRect)QRect::normalized();
      pQVar7 = QWidget::style((QWidget *)this);
      iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,5,0,0);
      auVar8 = QRect::operator|(&local_48,&this_00->elasticBand);
      local_58 = (qreal)CONCAT44(auVar8._4_4_ + iVar4 * -2,auVar8._0_4_ + iVar4 * -2);
      local_50 = (qreal)CONCAT44(auVar8._12_4_ + iVar4 * 2,auVar8._8_4_ + iVar4 * 2);
      this_01 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
      local_68 = QListViewPrivate::mapToViewport(this_00,(QRect *)&local_58,true);
      QWidget::update(this_01,&local_68);
      this_00->elasticBand = local_48;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::mouseMoveEvent(QMouseEvent *e)
{
    if (!isVisible())
        return;
    Q_D(QListView);
    QAbstractItemView::mouseMoveEvent(e);
    if (state() == DragSelectingState
        && d->showElasticBand
        && d->selectionMode != SingleSelection
        && d->selectionMode != NoSelection) {
        QRect rect(d->pressedPosition, e->position().toPoint() + QPoint(horizontalOffset(), verticalOffset()));
        rect = rect.normalized();
        const int margin = 2 * style()->pixelMetric(QStyle::PM_DefaultFrameWidth);
        const QRect viewPortRect = rect.united(d->elasticBand)
                                       .adjusted(-margin, -margin, margin, margin);
        d->viewport->update(d->mapToViewport(viewPortRect));
        d->elasticBand = rect;
    }
}